

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O2

void cm_zlib_inflate_fast(z_streamp strm,uint start)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uInt uVar4;
  uint uVar5;
  internal_state *piVar6;
  byte *pbVar7;
  long lVar8;
  ulg uVar9;
  Posf *pPVar10;
  ulg uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  uint uVar16;
  byte *pbVar17;
  uint uVar18;
  byte *pbVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  byte *pbVar23;
  byte *pbVar24;
  uint uVar25;
  Posf *pPVar26;
  ulong uVar27;
  int local_48;
  
  piVar6 = strm->state;
  pbVar17 = strm->next_in;
  pbVar19 = pbVar17 + (strm->avail_in - 5);
  pbVar7 = strm->next_out;
  uVar4 = strm->avail_out;
  local_48 = (int)pbVar7 - (start - uVar4);
  iVar14 = *(int *)((long)&piVar6->gzhead + 4);
  uVar11 = piVar6->gzindex;
  uVar5 = *(uint *)((long)&piVar6->gzindex + 4);
  bVar1 = *(byte *)&piVar6->head;
  lVar8 = *(long *)&piVar6->method;
  uVar27._0_4_ = piVar6->w_size;
  uVar27._4_4_ = piVar6->w_bits;
  bVar2 = *(byte *)((long)&piVar6->head + 4);
  uVar12 = piVar6->w_mask;
  uVar9 = piVar6->window_size;
  pPVar10 = piVar6->prev;
  pbVar23 = pbVar7;
LAB_00703988:
  if (uVar12 < 0xf) {
    bVar3 = *pbVar17;
    pbVar24 = pbVar17 + 1;
    pbVar17 = pbVar17 + 2;
    uVar27 = ((ulong)*pbVar24 << ((byte)uVar12 + 8 & 0x3f)) +
             ((ulong)bVar3 << ((byte)uVar12 & 0x3f)) + uVar27;
    uVar12 = uVar12 | 0x10;
  }
  pbVar24 = (byte *)(uVar9 + (ulong)((uint)uVar27 & ~(-1 << (bVar1 & 0x1f))) * 4);
  while( true ) {
    uVar27 = uVar27 >> (pbVar24[1] & 0x3f);
    uVar12 = uVar12 - pbVar24[1];
    bVar3 = *pbVar24;
    if (bVar3 == 0) break;
    if ((bVar3 & 0x10) != 0) {
      uVar25 = (uint)*(ushort *)(pbVar24 + 2);
      uVar16 = bVar3 & 0xf;
      if ((bVar3 & 0xf) != 0) {
        if (uVar12 < uVar16) {
          bVar3 = *pbVar17;
          pbVar17 = pbVar17 + 1;
          uVar27 = uVar27 + ((ulong)bVar3 << ((byte)uVar12 & 0x3f));
          uVar12 = uVar12 + 8;
        }
        uVar25 = (uint)*(ushort *)(pbVar24 + 2) + (~(-1 << (sbyte)uVar16) & (uint)uVar27);
        uVar27 = uVar27 >> (sbyte)uVar16;
        uVar12 = uVar12 - uVar16;
      }
      if (uVar12 < 0xf) {
        bVar3 = *pbVar17;
        pbVar24 = pbVar17 + 1;
        pbVar17 = pbVar17 + 2;
        uVar27 = ((ulong)*pbVar24 << ((byte)uVar12 + 8 & 0x3f)) +
                 ((ulong)bVar3 << ((byte)uVar12 & 0x3f)) + uVar27;
        uVar12 = uVar12 | 0x10;
      }
      lVar21 = (ulong)((uint)uVar27 & ~(-1 << (bVar2 & 0x1f))) * 2;
      goto LAB_00703a7e;
    }
    if ((bVar3 & 0x40) != 0) {
      iVar14 = 0x3f3f;
      if ((bVar3 & 0x20) != 0) goto LAB_00703d77;
      pcVar15 = "invalid literal/length code";
      goto LAB_00703d6e;
    }
    pbVar24 = (byte *)(uVar9 + (ulong)*(ushort *)(pbVar24 + 2) * 4 +
                      (ulong)(~(-1 << (bVar3 & 0x1f)) & (uint)uVar27) * 4);
  }
  *pbVar23 = pbVar24[2];
  pbVar24 = pbVar23 + 1;
  goto LAB_00703d2b;
LAB_00703a7e:
  pPVar26 = pPVar10 + lVar21;
  uVar27 = uVar27 >> (*(byte *)((long)pPVar26 + 1) & 0x3f);
  uVar12 = uVar12 - *(byte *)((long)pPVar26 + 1);
  bVar3 = (byte)*pPVar26;
  if ((bVar3 & 0x10) != 0) goto LAB_00703ac1;
  if ((bVar3 & 0x40) != 0) {
    pcVar15 = "invalid distance code";
    goto LAB_00703d6e;
  }
  lVar21 = (ulong)pPVar26[1] * 2 + (ulong)(~(-1 << (bVar3 & 0x1f)) & (uint)uVar27) * 2;
  goto LAB_00703a7e;
LAB_00703ac1:
  uVar16 = bVar3 & 0xf;
  if (uVar12 < uVar16) {
    uVar27 = ((ulong)*pbVar17 << ((byte)uVar12 & 0x3f)) + uVar27;
    uVar13 = uVar12 + 8;
    if (uVar13 < uVar16) {
      pbVar24 = pbVar17 + 1;
      pbVar17 = pbVar17 + 2;
      uVar27 = uVar27 + ((ulong)*pbVar24 << ((byte)uVar13 & 0x3f));
      uVar12 = uVar12 + 0x10;
    }
    else {
      pbVar17 = pbVar17 + 1;
      uVar12 = uVar13;
    }
  }
  uVar13 = (~(-1 << (sbyte)uVar16) & (uint)uVar27) + (uint)pPVar26[1];
  uVar27 = uVar27 >> (sbyte)uVar16;
  uVar12 = uVar12 - uVar16;
  uVar16 = (int)pbVar23 - local_48;
  uVar22 = (ulong)uVar13;
  uVar18 = uVar13 - uVar16;
  if (uVar13 < uVar16 || uVar18 == 0) {
    lVar21 = 0;
    uVar16 = uVar25;
    do {
      lVar20 = lVar21;
      pbVar23[lVar20] = pbVar23[lVar20 - uVar22];
      pbVar23[lVar20 + 1] = pbVar23[lVar20 + (1 - uVar22)];
      pbVar23[lVar20 + 2] = pbVar23[lVar20 + (2 - uVar22)];
      uVar16 = uVar16 - 3;
      lVar21 = lVar20 + 3;
    } while (2 < uVar16);
    if ((uint)lVar21 == uVar25) {
      pbVar24 = pbVar23 + lVar21;
    }
    else {
      pbVar23[lVar21] = pbVar23[lVar21 + -uVar22];
      if ((uint)lVar21 - uVar25 == -2) {
        pbVar24 = pbVar23 + lVar20 + 5;
        pbVar23[lVar20 + 4] = pbVar23[-uVar22 + 1 + lVar21];
      }
      else {
        pbVar24 = pbVar23 + lVar20 + 4;
      }
    }
    goto LAB_00703d2b;
  }
  if (((uint)uVar11 < uVar18) && (piVar6[1].dyn_ltree[0xf5] != (ct_data_s)0x0)) {
    pcVar15 = "invalid distance too far back";
LAB_00703d6e:
    strm->msg = pcVar15;
    iVar14 = 0x3f51;
LAB_00703d77:
    piVar6->status = iVar14;
    pbVar24 = pbVar23;
LAB_00703d7b:
    strm->next_in = pbVar17 + -(ulong)(uVar12 >> 3);
    strm->next_out = pbVar24;
    strm->avail_in = ((int)pbVar19 - (int)(pbVar17 + -(ulong)(uVar12 >> 3))) + 5;
    uVar27 = (ulong)((uint)uVar27 & ~(-1 << (sbyte)(uVar12 & 7)));
    strm->avail_out = ((int)(pbVar7 + (uVar4 - 0x101)) - (int)pbVar24) + 0x101;
    piVar6->w_size = (int)uVar27;
    piVar6->w_bits = (int)(uVar27 >> 0x20);
    piVar6->w_mask = uVar12 & 7;
    return;
  }
  if (uVar5 == 0) {
    lVar21 = (ulong)(iVar14 - uVar18) + lVar8;
    uVar16 = uVar25 - uVar18;
    if (uVar18 <= uVar25 && uVar16 != 0) {
      lVar20 = 0;
      do {
        *pbVar23 = *(byte *)(lVar21 + lVar20);
        pbVar23 = pbVar23 + 1;
        lVar20 = lVar20 + 1;
      } while (uVar18 != (uint)lVar20);
LAB_00703c97:
      lVar21 = (long)pbVar23 - uVar22;
      uVar25 = uVar16;
    }
  }
  else if (uVar5 < uVar18) {
    lVar21 = (ulong)((uVar5 + iVar14) - uVar18) + lVar8;
    uVar18 = uVar18 - uVar5;
    uVar16 = uVar25 - uVar18;
    if (uVar18 <= uVar25 && uVar16 != 0) {
      lVar20 = 0;
      do {
        pbVar23[lVar20] = *(byte *)(lVar21 + lVar20);
        lVar20 = lVar20 + 1;
      } while (uVar18 != (uint)lVar20);
      pbVar23 = pbVar23 + lVar20;
      lVar21 = lVar8;
      uVar25 = uVar16;
      if (uVar5 < uVar16) {
        lVar21 = 0;
        do {
          *pbVar23 = *(byte *)(lVar8 + lVar21);
          pbVar23 = pbVar23 + 1;
          lVar21 = lVar21 + 1;
        } while (uVar5 != (uint)lVar21);
        uVar16 = uVar16 - uVar5;
        goto LAB_00703c97;
      }
    }
  }
  else {
    lVar21 = (ulong)(uVar5 - uVar18) + lVar8;
    uVar16 = uVar25 - uVar18;
    if (uVar18 <= uVar25 && uVar16 != 0) {
      lVar20 = 0;
      do {
        *pbVar23 = *(byte *)(lVar21 + lVar20);
        pbVar23 = pbVar23 + 1;
        lVar20 = lVar20 + 1;
      } while (uVar18 != (uint)lVar20);
      goto LAB_00703c97;
    }
  }
  lVar20 = 0;
  for (uVar16 = uVar25; 2 < uVar16; uVar16 = uVar16 - 3) {
    pbVar23[lVar20] = *(byte *)(lVar21 + lVar20);
    pbVar23[lVar20 + 1] = *(byte *)(lVar21 + 1 + lVar20);
    pbVar23[lVar20 + 2] = *(byte *)(lVar21 + 2 + lVar20);
    lVar20 = lVar20 + 3;
  }
  if ((uint)lVar20 == uVar25) {
    pbVar24 = pbVar23 + lVar20;
  }
  else {
    pbVar23[lVar20] = *(byte *)(lVar21 + lVar20);
    if ((uint)lVar20 - uVar25 == -2) {
      pbVar24 = pbVar23 + lVar20 + 2;
      pbVar23[lVar20 + 1] = *(byte *)(lVar21 + 1 + lVar20);
    }
    else {
      pbVar24 = pbVar23 + lVar20 + 1;
    }
  }
LAB_00703d2b:
  if ((pbVar19 <= pbVar17) || (pbVar23 = pbVar24, pbVar7 + (uVar4 - 0x101) <= pbVar24))
  goto LAB_00703d7b;
  goto LAB_00703988;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(z_streamp strm, unsigned start) {
    struct inflate_state FAR *state;
    z_const unsigned char FAR *in;      /* local strm->next_in */
    z_const unsigned char FAR *last;    /* have enough input while in < last */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code const *here;           /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in;
    last = in + (strm->avail_in - 5);
    out = strm->next_out;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
        }
        here = lcode + (hold & lmask);
      dolen:
        op = (unsigned)(here->bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here->op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here->val >= 0x20 && here->val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here->val));
            *out++ = (unsigned char)(here->val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here->val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
            }
            here = dcode + (hold & dmask);
          dodist:
            op = (unsigned)(here->bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here->op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here->val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(*in++) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                *out++ = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            *out++ = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                *out++ = *from++;
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = window;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    *out++ = *from++;
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    }
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode + here->val + (hold & ((1U << op) - 1));
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode + here->val + (hold & ((1U << op) - 1));
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in;
    strm->next_out = out;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}